

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

_Bool background_thread_create_locked(tsd_t *tsd,uint arena_ind)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int8_t *piVar3;
  background_thread_info_t *thread;
  background_thread_info_t *pbVar4;
  background_thread_info_t *pbVar5;
  int iVar6;
  uint uVar7;
  void *arg;
  pthread_attr_t *attr;
  _func_void_ptr_void_ptr *extraout_RDX;
  _func_void_ptr_void_ptr *extraout_RDX_00;
  _func_void_ptr_void_ptr *start_routine;
  pthread_mutex_t *__mutex;
  _Bool _Var8;
  mutex_prof_data_t *data;
  atomic_b_t *paVar9;
  
  attr = (pthread_attr_t *)((ulong)arena_ind % max_background_threads);
  arg = (void *)((long)attr * 0xd0);
  thread = background_thread_info + (long)attr;
  pbVar4 = background_thread_info + (long)attr;
  __mutex = (pthread_mutex_t *)((long)&background_thread_info[(long)attr].mtx.field_0 + 0x40);
  iVar6 = pthread_mutex_trylock(__mutex);
  if (iVar6 != 0) {
    malloc_mutex_lock_slow(&pbVar4->mtx);
    (thread->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(thread->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if (&((thread->mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    (thread->mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    ppwVar2 = &(thread->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (((background_thread_enabled_state.repr & 1U) == 0) ||
     (thread->state != background_thread_stopped)) {
    paVar9 = &(thread->mtx).field_0.field_0.locked;
    _Var8 = false;
  }
  else {
    thread->state = background_thread_started;
    (thread->indefinite_sleep).repr = false;
    nstime_init(&thread->next_wakeup,0);
    thread->npages_to_purge_new = 0;
    thread->tot_n_runs = 0;
    nstime_init(&thread->tot_sleep_time,0);
    n_background_threads = n_background_threads + 1;
    (thread->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
    pbVar5 = background_thread_info;
    if (arena_ind == 0) {
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
           tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
      start_routine = extraout_RDX;
      if ((tsd->state).repr == '\0') {
        tsd_slow_update(tsd);
        start_routine = extraout_RDX_00;
      }
      uVar7 = background_thread_create_signals_masked(&thread->thread,attr,start_routine,arg);
      piVar3 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == '\0') {
        tsd_slow_update(tsd);
      }
      if (uVar7 == 0) {
        return uVar7 != 0;
      }
      paVar9 = &(thread->mtx).field_0.field_0.locked;
      malloc_printf("<jemalloc>: arena 0 background thread creation failed (%d)\n",(ulong)uVar7);
      iVar6 = pthread_mutex_trylock(__mutex);
      if (iVar6 != 0) {
        malloc_mutex_lock_slow(&pbVar4->mtx);
        paVar9->repr = true;
      }
      puVar1 = &(thread->mtx).field_0.field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if (&((thread->mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
        (thread->mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
        ppwVar2 = &(thread->mtx).field_0.witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
      thread->state = background_thread_stopped;
      n_background_threads = n_background_threads - 1;
      _Var8 = true;
    }
    else {
      __mutex = (pthread_mutex_t *)((long)&(background_thread_info->mtx).field_0 + 0x40);
      iVar6 = pthread_mutex_trylock(__mutex);
      if (iVar6 != 0) {
        malloc_mutex_lock_slow(&pbVar5->mtx);
        (pbVar5->mtx).field_0.field_0.locked.repr = true;
      }
      puVar1 = &(pbVar5->mtx).field_0.field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if (&((pbVar5->mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
        (pbVar5->mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
        ppwVar2 = &(pbVar5->mtx).field_0.witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
      pthread_cond_signal((pthread_cond_t *)&pbVar5->cond);
      paVar9 = &(pbVar5->mtx).field_0.field_0.locked;
      _Var8 = false;
    }
  }
  paVar9->repr = false;
  pthread_mutex_unlock(__mutex);
  return _Var8;
}

Assistant:

static bool
background_thread_create_locked(tsd_t *tsd, unsigned arena_ind) {
	assert(have_background_thread);
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &background_thread_lock);

	/* We create at most NCPUs threads. */
	size_t thread_ind = arena_ind % max_background_threads;
	background_thread_info_t *info = &background_thread_info[thread_ind];

	bool need_new_thread;
	malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
	need_new_thread = background_thread_enabled() &&
	    (info->state == background_thread_stopped);
	if (need_new_thread) {
		background_thread_init(tsd, info);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
	if (!need_new_thread) {
		return false;
	}
	if (arena_ind != 0) {
		/* Threads are created asynchronously by Thread 0. */
		background_thread_info_t *t0 = &background_thread_info[0];
		malloc_mutex_lock(tsd_tsdn(tsd), &t0->mtx);
		assert(t0->state == background_thread_started);
		pthread_cond_signal(&t0->cond);
		malloc_mutex_unlock(tsd_tsdn(tsd), &t0->mtx);

		return false;
	}

	pre_reentrancy(tsd, NULL);
	/*
	 * To avoid complications (besides reentrancy), create internal
	 * background threads with the underlying pthread_create.
	 */
	int err = background_thread_create_signals_masked(&info->thread, NULL,
	    background_thread_entry, (void *)thread_ind);
	post_reentrancy(tsd);

	if (err != 0) {
		malloc_printf("<jemalloc>: arena 0 background thread creation "
		    "failed (%d)\n", err);
		malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
		info->state = background_thread_stopped;
		n_background_threads--;
		malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);

		return true;
	}

	return false;
}